

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_features.pb.cc
# Opt level: O2

uint8_t * __thiscall
pb::TestFeatures::_InternalSerialize(TestFeatures *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  uVar1 = *(uint *)&this->field_0;
  if ((uVar1 & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (1,(this->field_0)._impl_.file_feature_,puVar3);
  }
  if ((uVar1 & 2) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (2,(this->field_0)._impl_.extension_range_feature_,puVar3);
  }
  if ((uVar1 & 4) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (3,(this->field_0)._impl_.message_feature_,puVar3);
  }
  if ((uVar1 & 8) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (4,(this->field_0)._impl_.field_feature_,puVar3);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (5,(this->field_0)._impl_.oneof_feature_,puVar3);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (6,(this->field_0)._impl_.enum_feature_,puVar3);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (7,(this->field_0)._impl_.enum_entry_feature_,puVar3);
  }
  if ((char)uVar1 < '\0') {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (8,(this->field_0)._impl_.service_feature_,puVar3);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (9,(this->field_0)._impl_.method_feature_,puVar3);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (10,(this->field_0)._impl_.multiple_feature_,puVar3);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0xb,(this->field_0)._impl_.bool_field_feature_,puVar3);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0xf,(this->field_0)._impl_.source_feature_,puVar3);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x10,(this->field_0)._impl_.source_feature2_,puVar3);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x11,(this->field_0)._impl_.removed_feature_,puVar3);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x12,(this->field_0)._impl_.future_feature_,puVar3);
  }
  if ((short)uVar1 < 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x13,(this->field_0)._impl_.legacy_feature_,puVar3);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x14,(this->field_0)._impl_.value_lifetime_feature_,puVar3);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestFeatures::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestFeatures& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:pb.TestFeatures)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .pb.EnumFeature file_feature = 1 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_file_feature(), target);
  }

  // .pb.EnumFeature extension_range_feature = 2 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_EXTENSION_RANGE, edition_defaults = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_extension_range_feature(), target);
  }

  // .pb.EnumFeature message_feature = 3 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_MESSAGE, edition_defaults = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_message_feature(), target);
  }

  // .pb.EnumFeature field_feature = 4 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, edition_defaults = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_field_feature(), target);
  }

  // .pb.EnumFeature oneof_feature = 5 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_ONEOF, edition_defaults = {
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_oneof_feature(), target);
  }

  // .pb.EnumFeature enum_feature = 6 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_ENUM, edition_defaults = {
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        6, this_._internal_enum_feature(), target);
  }

  // .pb.EnumFeature enum_entry_feature = 7 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_ENUM_ENTRY, edition_defaults = {
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        7, this_._internal_enum_entry_feature(), target);
  }

  // .pb.EnumFeature service_feature = 8 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_SERVICE, edition_defaults = {
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        8, this_._internal_service_feature(), target);
  }

  // .pb.EnumFeature method_feature = 9 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_METHOD, edition_defaults = {
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        9, this_._internal_method_feature(), target);
  }

  // .pb.EnumFeature multiple_feature = 10 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_ENUM_ENTRY, targets = TARGET_TYPE_SERVICE, targets = TARGET_TYPE_METHOD, targets = TARGET_TYPE_ONEOF, targets = TARGET_TYPE_EXTENSION_RANGE, edition_defaults = {
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        10, this_._internal_multiple_feature(), target);
  }

  // bool bool_field_feature = 11 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, edition_defaults = {
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        11, this_._internal_bool_field_feature(), target);
  }

  // .pb.EnumFeature source_feature = 15 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_ENUM_ENTRY, targets = TARGET_TYPE_SERVICE, targets = TARGET_TYPE_METHOD, targets = TARGET_TYPE_ONEOF, targets = TARGET_TYPE_EXTENSION_RANGE, edition_defaults = {
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        15, this_._internal_source_feature(), target);
  }

  // .pb.EnumFeature source_feature2 = 16 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_ENUM_ENTRY, targets = TARGET_TYPE_SERVICE, targets = TARGET_TYPE_METHOD, targets = TARGET_TYPE_ONEOF, targets = TARGET_TYPE_EXTENSION_RANGE, edition_defaults = {
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        16, this_._internal_source_feature2(), target);
  }

  // .pb.EnumFeature removed_feature = 17 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_FIELD, edition_defaults = {
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        17, this_._internal_removed_feature(), target);
  }

  // .pb.EnumFeature future_feature = 18 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_FIELD, edition_defaults = {
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        18, this_._internal_future_feature(), target);
  }

  // .pb.EnumFeature legacy_feature = 19 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_FIELD, edition_defaults = {
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        19, this_._internal_legacy_feature(), target);
  }

  // .pb.ValueLifetimeFeature value_lifetime_feature = 20 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        20, this_._internal_value_lifetime_feature(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:pb.TestFeatures)
  return target;
}